

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionNode.cxx
# Opt level: O3

PolicyID policyForString(char *policy_id)

{
  int iVar1;
  PolicyID PVar2;
  
  iVar1 = strcmp(policy_id,"CMP0003");
  if (iVar1 == 0) {
    PVar2 = CMP0003;
  }
  else {
    iVar1 = strcmp(policy_id,"CMP0004");
    if (iVar1 == 0) {
      PVar2 = CMP0004;
    }
    else {
      iVar1 = strcmp(policy_id,"CMP0008");
      if (iVar1 == 0) {
        PVar2 = CMP0008;
      }
      else {
        iVar1 = strcmp(policy_id,"CMP0020");
        if (iVar1 == 0) {
          PVar2 = CMP0020;
        }
        else {
          iVar1 = strcmp(policy_id,"CMP0021");
          if (iVar1 == 0) {
            PVar2 = CMP0021;
          }
          else {
            iVar1 = strcmp(policy_id,"CMP0022");
            if (iVar1 == 0) {
              PVar2 = CMP0022;
            }
            else {
              iVar1 = strcmp(policy_id,"CMP0027");
              if (iVar1 == 0) {
                PVar2 = CMP0027;
              }
              else {
                iVar1 = strcmp(policy_id,"CMP0037");
                if (iVar1 == 0) {
                  PVar2 = CMP0037;
                }
                else {
                  iVar1 = strcmp(policy_id,"CMP0038");
                  if (iVar1 == 0) {
                    PVar2 = CMP0038;
                  }
                  else {
                    iVar1 = strcmp(policy_id,"CMP0041");
                    if (iVar1 == 0) {
                      PVar2 = CMP0041;
                    }
                    else {
                      iVar1 = strcmp(policy_id,"CMP0042");
                      if (iVar1 == 0) {
                        PVar2 = CMP0042;
                      }
                      else {
                        iVar1 = strcmp(policy_id,"CMP0046");
                        if (iVar1 == 0) {
                          PVar2 = CMP0046;
                        }
                        else {
                          iVar1 = strcmp(policy_id,"CMP0052");
                          if (iVar1 == 0) {
                            PVar2 = CMP0052;
                          }
                          else {
                            iVar1 = strcmp(policy_id,"CMP0060");
                            if (iVar1 == 0) {
                              PVar2 = CMP0060;
                            }
                            else {
                              iVar1 = strcmp(policy_id,"CMP0063");
                              if (iVar1 == 0) {
                                PVar2 = CMP0063;
                              }
                              else {
                                iVar1 = strcmp(policy_id,"CMP0065");
                                if (iVar1 == 0) {
                                  PVar2 = CMP0065;
                                }
                                else {
                                  iVar1 = strcmp(policy_id,"CMP0068");
                                  if (iVar1 == 0) {
                                    PVar2 = CMP0068;
                                  }
                                  else {
                                    iVar1 = strcmp(policy_id,"CMP0069");
                                    if (iVar1 == 0) {
                                      PVar2 = CMP0069;
                                    }
                                    else {
                                      iVar1 = strcmp(policy_id,"CMP0073");
                                      if (iVar1 == 0) {
                                        PVar2 = CMP0073;
                                      }
                                      else {
                                        iVar1 = strcmp(policy_id,"CMP0076");
                                        if (iVar1 == 0) {
                                          PVar2 = CMP0076;
                                        }
                                        else {
                                          iVar1 = strcmp(policy_id,"CMP0081");
                                          if (iVar1 == 0) {
                                            PVar2 = CMP0081;
                                          }
                                          else {
                                            iVar1 = strcmp(policy_id,"CMP0083");
                                            if (iVar1 == 0) {
                                              PVar2 = CMP0083;
                                            }
                                            else {
                                              iVar1 = strcmp(policy_id,"CMP0095");
                                              PVar2 = CMP0095;
                                              if (iVar1 != 0) {
                                                __assert_fail(
                                                  "false && \"Unreachable code. Not a valid policy\""
                                                  ,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/cmGeneratorExpressionNode.cxx"
                                                  ,0x64e,
                                                  "cmPolicies::PolicyID policyForString(const char *)"
                                                  );
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return PVar2;
}

Assistant:

cmPolicies::PolicyID policyForString(const char* policy_id)
{
#define RETURN_POLICY_ID(POLICY_ID)                                           \
  if (strcmp(policy_id, #POLICY_ID) == 0) {                                   \
    return cmPolicies::POLICY_ID;                                             \
  }

  CM_FOR_EACH_TARGET_POLICY(RETURN_POLICY_ID)

#undef RETURN_POLICY_ID

  assert(false && "Unreachable code. Not a valid policy");
  return cmPolicies::CMP0002;
}